

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_service_client
          (t_swift_generator *this,ostream *out,t_service *tservice)

{
  bool bVar1;
  t_service *ptVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = this->gen_cocoa_;
  poVar4 = t_generator::indent((t_generator *)this,out);
  if (bVar1 == false) {
    poVar4 = std::operator<<(poVar4,"open class ");
    iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_01,iVar3));
    std::operator<<(poVar4,"Client");
    ptVar2 = tservice->extends_;
    poVar4 = std::operator<<(out," : ");
    if (ptVar2 == (t_service *)0x0) {
      std::__cxx11::string::string((string *)&local_50,"TClient",&local_51);
    }
    else {
      iVar3 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_02,iVar3),"Client");
    }
    std::operator<<(poVar4,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    poVar4 = std::operator<<(out," /* , ");
    iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_03,iVar3));
    std::operator<<(poVar4," */");
    block_open(this,out);
  }
  else {
    poVar4 = std::operator<<(poVar4,"public class ");
    iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var,iVar3));
    poVar4 = std::operator<<(poVar4,"Client /* : ");
    iVar3 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
    poVar4 = std::operator<<(poVar4,(string *)CONCAT44(extraout_var_00,iVar3));
    std::operator<<(poVar4," */");
    block_open(this,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"let __inProtocol : TProtocol");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"let __outProtocol : TProtocol");
    poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"public init(inoutProtocol: TProtocol)");
    block_open(this,out);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"__inProtocol = inoutProtocol");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"__outProtocol = inoutProtocol");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"public init(inProtocol: TProtocol, outProtocol: TProtocol)");
    block_open(this,out);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"__inProtocol = inProtocol");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"__outProtocol = outProtocol");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    block_close(this,out,true);
  }
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client(ostream& out, t_service* tservice) {
  if (!gen_cocoa_) {
    indent(out) << "open class " << tservice->get_name() << "Client";// : "

    // Inherit from ParentClient
    t_service* parent = tservice->get_extends();
    out << " : " << ((parent == nullptr) ? "TClient" : parent->get_name() + "Client");
    out <<  " /* , " << tservice->get_name() << " */";
    block_open(out);
    out << endl;
  } else {
    // a
    indent(out) << "public class " << tservice->get_name() << "Client /* : " << tservice->get_name() << " */";
    block_open(out);
    out << endl;

    indent(out) << "let __inProtocol : TProtocol" << endl << endl;
    indent(out) << "let __outProtocol : TProtocol" << endl << endl;
    indent(out) << "public init(inoutProtocol: TProtocol)";
    block_open(out);

    indent(out) << "__inProtocol = inoutProtocol" << endl;
    indent(out) << "__outProtocol = inoutProtocol" << endl;
    block_close(out);
    out << endl;

    indent(out) << "public init(inProtocol: TProtocol, outProtocol: TProtocol)";
    block_open(out);
    indent(out) << "__inProtocol = inProtocol" << endl;
    indent(out) << "__outProtocol = outProtocol" << endl;
    block_close(out);
    out << endl;
  }

  block_close(out);
  out << endl;
}